

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O0

void __thiscall MxxSort_Unique_Test::~MxxSort_Unique_Test(MxxSort_Unique_Test *this)

{
  MxxSort_Unique_Test *this_local;
  
  ~MxxSort_Unique_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxSort, Unique) {
    mxx::comm c;
    std::vector<int> vec(100);
    std::srand(13*c.rank());
    int i = 0;
    std::generate(vec.begin(), vec.end(), [&i](){return i++ % 10;});
    mxx::sort(vec.begin(), vec.end());
    std::vector<int>::iterator newend = mxx::unique(vec.begin(), vec.end());
    std::vector<int> unique_els(vec.begin(), newend);

    mxx::sync_cout(c) << "[Rank " << c.rank() << "]: Found " << unique_els.size() << " unique elements: " << unique_els << std::endl;

    std::vector<int> all = mxx::allgatherv(unique_els);
    ASSERT_EQ(10ul, all.size());
    for (size_t i = 0; i < all.size(); ++i) {
        ASSERT_EQ((int)i, all[i]);
    }
}